

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Molecule.cpp
# Opt level: O2

void __thiscall OpenMD::Molecule::addConstraintElem(Molecule *this,ConstraintElem *cp)

{
  __normal_iterator<OpenMD::ConstraintElem_**,_std::vector<OpenMD::ConstraintElem_*,_std::allocator<OpenMD::ConstraintElem_*>_>_>
  _Var1;
  ConstraintElem *local_10;
  
  local_10 = cp;
  _Var1 = std::
          __find_if<__gnu_cxx::__normal_iterator<OpenMD::ConstraintElem**,std::vector<OpenMD::ConstraintElem*,std::allocator<OpenMD::ConstraintElem*>>>,__gnu_cxx::__ops::_Iter_equals_val<OpenMD::ConstraintElem*const>>
                    ((this->constraintElems_).
                     super__Vector_base<OpenMD::ConstraintElem_*,_std::allocator<OpenMD::ConstraintElem_*>_>
                     ._M_impl.super__Vector_impl_data._M_start,
                     (this->constraintElems_).
                     super__Vector_base<OpenMD::ConstraintElem_*,_std::allocator<OpenMD::ConstraintElem_*>_>
                     ._M_impl.super__Vector_impl_data._M_finish);
  if (_Var1._M_current ==
      (this->constraintElems_).
      super__Vector_base<OpenMD::ConstraintElem_*,_std::allocator<OpenMD::ConstraintElem_*>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    std::vector<OpenMD::ConstraintElem_*,_std::allocator<OpenMD::ConstraintElem_*>_>::push_back
              (&this->constraintElems_,&local_10);
  }
  return;
}

Assistant:

void Molecule::addConstraintElem(ConstraintElem* cp) {
    if (std::find(constraintElems_.begin(), constraintElems_.end(), cp) ==
        constraintElems_.end()) {
      constraintElems_.push_back(cp);
    }
  }